

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.cpp
# Opt level: O3

writer * argo::operator<<(writer *w,char c)

{
  size_t sVar1;
  char s [2];
  char local_42 [2];
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  local_42[1] = 0;
  local_42[0] = c;
  local_40[0] = local_30;
  sVar1 = strlen(local_42);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,local_42,local_42 + sVar1);
  (*w->_vptr_writer[2])(w,(string *)local_40);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  return w;
}

Assistant:

writer &NAMESPACE::operator<<(writer& w, char c)
{
    char s[2];
    s[0] = c;
    s[1] = '\0';
    w.write(s);
    return w;
}